

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O2

loss_function * getLossFunction(vw *all,string *funcName,float function_parameter)

{
  int iVar1;
  loss_function *plVar2;
  ostream *poVar3;
  vw_exception *this;
  undefined **ppuVar4;
  string local_1c0;
  stringstream __msg;
  ostream local_190;
  
  iVar1 = std::__cxx11::string::compare((char *)funcName);
  if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)funcName), iVar1 == 0)) {
    plVar2 = (loss_function *)operator_new(8);
    ppuVar4 = &PTR_getType_abi_cxx11__002adb18;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)funcName);
    if (iVar1 == 0) {
      plVar2 = (loss_function *)operator_new(8);
      ppuVar4 = &PTR_getType_abi_cxx11__002adba0;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)funcName);
      if (iVar1 == 0) {
        plVar2 = (loss_function *)operator_new(8);
        ppuVar4 = &PTR_getType_abi_cxx11__002adc18;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)funcName);
        if (iVar1 == 0) {
          if (all->set_minmax != noop_mm) {
            all->sd->min_label = -50.0;
            all->sd->max_label = 50.0;
          }
          plVar2 = (loss_function *)operator_new(8);
          ppuVar4 = &PTR_getType_abi_cxx11__002adc90;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)funcName);
          if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)funcName), iVar1 == 0)
              ) || (iVar1 = std::__cxx11::string::compare((char *)funcName), iVar1 == 0)) {
            plVar2 = (loss_function *)operator_new(0x10);
            plVar2->_vptr_loss_function = (_func_int **)&PTR_getType_abi_cxx11__002add08;
            *(float *)&plVar2[1]._vptr_loss_function = function_parameter;
            return plVar2;
          }
          iVar1 = std::__cxx11::string::compare((char *)funcName);
          if (iVar1 != 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
            poVar3 = std::operator<<(&local_190,"Invalid loss function name: \'");
            poVar3 = std::operator<<(poVar3,(string *)funcName);
            std::operator<<(poVar3,"\' Bailing!");
            this = (vw_exception *)__cxa_allocate_exception(0x38);
            std::__cxx11::stringbuf::str();
            VW::vw_exception::vw_exception
                      (this,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/loss_functions.cc"
                       ,0x18b,&local_1c0);
            __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
          }
          if (all->set_minmax != noop_mm) {
            all->sd->min_label = -50.0;
            all->sd->max_label = 50.0;
          }
          plVar2 = (loss_function *)operator_new(8);
          ppuVar4 = &PTR_getType_abi_cxx11__002add80;
        }
      }
    }
  }
  plVar2->_vptr_loss_function = (_func_int **)ppuVar4;
  return plVar2;
}

Assistant:

loss_function* getLossFunction(vw& all, string funcName, float function_parameter)
{
  if (funcName.compare("squared") == 0 || funcName.compare("Huber") == 0)
    return new squaredloss();
  else if (funcName.compare("classic") == 0)
    return new classic_squaredloss();
  else if (funcName.compare("hinge") == 0)
    return new hingeloss();
  else if (funcName.compare("logistic") == 0)
  {
    if (all.set_minmax != noop_mm)
    {
      all.sd->min_label = -50;
      all.sd->max_label = 50;
    }
    return new logloss();
  }
  else if (funcName.compare("quantile") == 0 || funcName.compare("pinball") == 0 || funcName.compare("absolute") == 0)
  {
    return new quantileloss(function_parameter);
  }
  else if (funcName.compare("poisson") == 0)
  {
    if (all.set_minmax != noop_mm)
    {
      all.sd->min_label = -50;
      all.sd->max_label = 50;
    }
    return new poisson_loss();
  }
  else
    THROW("Invalid loss function name: \'" << funcName << "\' Bailing!");
}